

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

UClassID __thiscall icu_63::DecimalFormat::getDynamicClassID(DecimalFormat *this)

{
  return &getStaticClassID::classID;
}

Assistant:

DecimalFormat::DecimalFormat(UErrorCode& status)
        : DecimalFormat(nullptr, status) {
    // Use the default locale and decimal pattern.
    const char* localeName = Locale::getDefault().getName();
    LocalPointer<NumberingSystem> ns(NumberingSystem::createInstance(status));
    UnicodeString patternString = utils::getPatternForStyle(
            localeName,
            ns->getName(),
            CLDR_PATTERN_STYLE_DECIMAL,
            status);
    setPropertiesFromPattern(patternString, IGNORE_ROUNDING_IF_CURRENCY, status);
    touch(status);
}